

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

TrackData * Generate8KSectorTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  bool bVar1;
  int iVar2;
  Data *pDVar3;
  BitBuffer *bitstream;
  undefined1 local_d0 [8];
  Data data;
  Sector *sector;
  undefined1 local_a0 [8];
  BitstreamTrackBuilder bitbuf;
  Track *track_local;
  CylHead *cylhead_local;
  
  bitbuf.m_buffer._96_8_ = track;
  bVar1 = Is8KSectorTrack(track);
  if (!bVar1) {
    __assert_fail("Is8KSectorTrack(track)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                  ,0x2ae,"TrackData Generate8KSectorTrack(const CylHead &, const Track &)");
  }
  BitstreamTrackBuilder::BitstreamTrackBuilder((BitstreamTrackBuilder *)local_a0,_250K,MFM);
  TrackBuilder::addGap((TrackBuilder *)local_a0,0x10,-1);
  TrackBuilder::addIAM((TrackBuilder *)local_a0);
  TrackBuilder::addGap((TrackBuilder *)local_a0,0x10,-1);
  data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)Track::operator[]((Track *)bitbuf.m_buffer._96_8_,0);
  TrackBuilder::addSectorUpToData
            ((TrackBuilder *)local_a0,
             (Header *)
             data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             ((Sector *)
             data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage)->dam);
  pDVar3 = Sector::data_copy((Sector *)
                             data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  Data::Data((Data *)local_d0,pDVar3);
  iVar2 = Data::size((Data *)local_d0);
  if (0x18a3 < iVar2) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,0x18a3);
  }
  TrackBuilder::addBlock((TrackBuilder *)local_a0,(Data *)local_d0);
  iVar2 = Data::size((Data *)local_d0);
  TrackBuilder::addGap((TrackBuilder *)local_a0,0x18a3 - iVar2,-1);
  bitstream = BitstreamTrackBuilder::buffer((BitstreamTrackBuilder *)local_a0);
  TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
  Data::~Data((Data *)local_d0);
  BitstreamTrackBuilder::~BitstreamTrackBuilder((BitstreamTrackBuilder *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

TrackData Generate8KSectorTrack(const CylHead& cylhead, const Track& track)
{
    assert(Is8KSectorTrack(track));

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addGap(16);  // gap 4a
    bitbuf.addIAM();
    bitbuf.addGap(16);  // gap 1

    auto& sector{ track[0] };
    bitbuf.addSectorUpToData(sector.header, sector.dam);

    // Maximum size of long-track version used by Coin-Op Hits
    static constexpr auto max_size{ 0x18a3 };
    auto data = sector.data_copy();
    if (data.size() > max_size)
        data.resize(max_size);

    bitbuf.addBlock(data);
    bitbuf.addGap(max_size - data.size());

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}